

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  _func_int **value;
  type tVar1;
  uint value_00;
  string *result;
  char *pcVar2;
  ulong __n;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  memory_buffer buffer;
  unsigned___int128 in_stack_fffffffffffffdb8;
  buffer<char> local_238;
  char local_218 [512];
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args.
         super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         .desc_;
  args_00.desc_ = format_str.size_;
  format_str_00.size_ = format_str.data_;
  if ((format_str_00.size_ == (char *)0x2) && (*(short *)this == 0x7d7b)) {
    if ((long)args_00.desc_ < 0) {
      if (((int)(type)format_str.size_ < 1) ||
         (tVar1 = (args_00.field_1.args_)->type_, tVar1 == none_type)) goto LAB_0013aff7;
    }
    else {
      tVar1 = (type)format_str.size_ & custom_type;
      if (((undefined1  [16])format_str & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0013aff7:
        error_handler::on_error((error_handler *)&local_238,"argument not found");
      }
    }
    value = (_func_int **)((args_00.field_1.values_)->field_0).ulong_long_value;
    pcVar2 = (char *)((args_00.field_1.values_)->field_0).string.size;
    value_00 = (uint)value;
    switch(tVar1) {
    case int_type:
      to_string<int,_0>(__return_storage_ptr__,value_00);
      break;
    case uint_type:
      to_string<unsigned_int,_0>(__return_storage_ptr__,value_00);
      break;
    case long_long_type:
      to_string<long_long,_0>(__return_storage_ptr__,(longlong)value);
      break;
    case ulong_long_type:
      to_string<unsigned_long_long,_0>(__return_storage_ptr__,(unsigned_long_long)value);
      break;
    case int128_type:
      to_string<__int128,_0>(__return_storage_ptr__,in_stack_fffffffffffffdb8);
      break;
    case uint128_type:
      to_string<unsigned___int128,_0>(__return_storage_ptr__,in_stack_fffffffffffffdb8);
      break;
    case bool_type:
      pcVar2 = "false";
      __n = (ulong)(value_00 & 1) ^ 5;
      if (((ulong)value & 1) != 0) {
        pcVar2 = "true";
      }
      memcpy(&local_238,pcVar2,__n);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,&local_238,(long)&local_238._vptr_buffer + __n);
      break;
    case char_type:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = (char)value;
      __return_storage_ptr__->_M_string_length = 1;
      (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
      break;
    case float_type:
      local_238._vptr_buffer = (_func_int **)CONCAT44(local_238._vptr_buffer._4_4_,value_00);
      to_string<float,_0>(__return_storage_ptr__,(float *)&local_238);
      break;
    case double_type:
      local_238._vptr_buffer = value;
      to_string<double,_0>(__return_storage_ptr__,(double *)&local_238);
      break;
    case last_numeric_type:
      local_238.ptr_ = (char *)CONCAT62(local_238.ptr_._2_6_,(short)pcVar2);
      local_238._vptr_buffer = value;
      to_string<long_double,_0>(__return_storage_ptr__,(longdouble *)&local_238);
      break;
    case cstring_type:
      local_238._vptr_buffer = value;
      to_string<const_char_*,_0>(__return_storage_ptr__,(char **)&local_238);
      break;
    case string_type:
      local_238._vptr_buffer = value;
      local_238.ptr_ = pcVar2;
      to_string<fmt::v7::basic_string_view<char>,_0>
                (__return_storage_ptr__,(basic_string_view<char> *)&local_238);
      break;
    case pointer_type:
      local_238._vptr_buffer = value;
      to_string<const_void_*,_0>(__return_storage_ptr__,&local_238._vptr_buffer);
      break;
    case custom_type:
      stringifier::operator()[abi_cxx11_
                (__return_storage_ptr__,(stringifier *)&stack0xfffffffffffffdc7,
                 (handle)((args_00.field_1.values_)->field_0).string);
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
                  ,0x7d7,"");
    }
  }
  else {
    local_238.size_ = 0;
    local_238._vptr_buffer = (_func_int **)&PTR_grow_00791970;
    local_238.capacity_ = 500;
    format_str_00.data_ = (char *)this;
    local_238.ptr_ = local_218;
    vformat_to<char>(&local_238,format_str_00,args_00,(locale_ref)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_238.ptr_,local_238.ptr_ + local_238.size_);
    if (local_238.ptr_ != local_218) {
      operator_delete(local_238.ptr_,local_238.capacity_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}